

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Ptr_t * Acb_GenerateSignalNames2(Vec_Wec_t *vGates,Vec_Ptr_t *vIns,Vec_Ptr_t *vOuts)

{
  int iVar1;
  int nSize;
  int iVar2;
  Vec_Ptr_t *p;
  Vec_Str_t *p_00;
  char *pcVar3;
  Vec_Int_t *p_01;
  void *pvVar4;
  int i;
  int iVar5;
  int i_00;
  uint uVar6;
  
  i = vIns->nSize;
  iVar1 = vOuts->nSize;
  nSize = vGates->nSize;
  p = Vec_PtrStart(nSize);
  p_00 = Vec_StrAlloc(1000);
  for (iVar5 = 0; iVar5 < vIns->nSize; iVar5 = iVar5 + 1) {
    pcVar3 = (char *)Vec_PtrEntry(vIns,iVar5);
    pcVar3 = Abc_UtilStrsav(pcVar3);
    Vec_PtrWriteEntry(p,iVar5,pcVar3);
  }
  iVar5 = (nSize - (iVar1 + i)) + i;
  i_00 = 0;
  uVar6 = 1;
  while( true ) {
    if (vOuts->nSize <= i_00) {
      for (; i < iVar5; i = i + 1) {
        pvVar4 = Vec_PtrEntry(p,i);
        if (pvVar4 == (void *)0x0) {
          Vec_StrPrintF(p_00,"ww%d",(ulong)uVar6);
          Vec_StrPush(p_00,'\0');
          pcVar3 = p_00->pArray;
          p_00->nCap = 0;
          p_00->nSize = 0;
          p_00->pArray = (char *)0x0;
          Vec_PtrWriteEntry(p,i,pcVar3);
          uVar6 = uVar6 + 1;
        }
      }
      Vec_StrFree(p_00);
      return p;
    }
    pcVar3 = (char *)Vec_PtrEntry(vOuts,i_00);
    p_01 = Vec_WecEntry(vGates,(nSize - iVar1) + i_00);
    iVar2 = Vec_IntEntry(p_01,0);
    if (iVar2 != 0xb) break;
    iVar2 = Vec_IntEntry(p_01,1);
    pcVar3 = Abc_UtilStrsav(pcVar3);
    Vec_PtrWriteEntry(p,iVar2,pcVar3);
    i_00 = i_00 + 1;
  }
  __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                ,0x837,"Vec_Ptr_t *Acb_GenerateSignalNames2(Vec_Wec_t *, Vec_Ptr_t *, Vec_Ptr_t *)")
  ;
}

Assistant:

Vec_Ptr_t * Acb_GenerateSignalNames2( Vec_Wec_t * vGates, Vec_Ptr_t * vIns, Vec_Ptr_t * vOuts )
{
    int nIns = Vec_PtrSize(vIns), nOuts = Vec_PtrSize(vOuts);
    int nNodes = Vec_WecSize(vGates) - nIns - nOuts;
    Vec_Ptr_t * vRes = Vec_PtrStart( Vec_WecSize(vGates) ); char * pName;
    Vec_Str_t * vStr = Vec_StrAlloc(1000); int i, nWires = 1;
    // create input names
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_PtrWriteEntry( vRes, i, Abc_UtilStrsav(pName) );
    // create names for nodes driving outputs
    Vec_PtrForEachEntry( char *, vOuts, pName, i )
    {
        Vec_Int_t * vGate = Vec_WecEntry( vGates, nIns + nNodes + i );
        assert( Vec_IntEntry(vGate, 0) == ABC_OPER_BIT_BUF );
        Vec_PtrWriteEntry( vRes, Vec_IntEntry(vGate, 1), Abc_UtilStrsav(pName) );
    }
    for ( i = nIns; i < nIns + nNodes; i++ )
        if ( Vec_PtrEntry(vRes, i) == NULL )
        {
            Vec_StrPrintF( vStr, "ww%d", nWires++ );
            Vec_StrPush( vStr, '\0' );
            Vec_PtrWriteEntry( vRes, i, Vec_StrReleaseArray(vStr) );
        }
    Vec_StrFree( vStr );
    return vRes;
}